

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.cpp
# Opt level: O2

void __thiscall
booster::aio::basic_socket::set_option(basic_socket *this,boolean_option_type opt,bool v)

{
  int iVar1;
  system_error *this_00;
  error_code eVar2;
  error_code e;
  
  e._M_value = 0;
  e._M_cat = (error_category *)std::_V2::system_category();
  set_option(this,opt,v,&e);
  iVar1 = e._M_value;
  if (e._M_value == 0) {
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x40);
  eVar2._4_4_ = 0;
  eVar2._M_value = iVar1;
  eVar2._M_cat = e._M_cat;
  system::system_error::system_error(this_00,eVar2);
  __cxa_throw(this_00,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void basic_socket::set_option(boolean_option_type opt,bool v)
{
	system::error_code e;
	set_option(opt,v,e);
	if(e) throw system::system_error(e);
}